

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool-options.h
# Opt level: O0

void __thiscall wasm::ToolOptions::applyFeatures(ToolOptions *this,Module *module)

{
  bool bVar1;
  int iVar2;
  Fatal local_1a0;
  Module *local_18;
  Module *module_local;
  ToolOptions *this_local;
  
  local_18 = module;
  module_local = (Module *)this;
  FeatureSet::enable(&module->features,&this->enabledFeatures);
  FeatureSet::disable(&local_18->features,&this->disabledFeatures);
  bVar1 = FeatureSet::hasGC(&local_18->features);
  if (!bVar1) {
    iVar2 = ::wasm::getTypeSystem();
    if (iVar2 == 1) {
      Fatal::Fatal(&local_1a0);
      Fatal::operator<<(&local_1a0,
                        (char (*) [50])"Nominal typing is only allowed when GC is enabled");
      Fatal::~Fatal(&local_1a0);
    }
  }
  return;
}

Assistant:

void applyFeatures(Module& module) const {
    module.features.enable(enabledFeatures);
    module.features.disable(disabledFeatures);
    // Non-default type systems only make sense with GC enabled.
    if (!module.features.hasGC() && getTypeSystem() == TypeSystem::Nominal) {
      Fatal() << "Nominal typing is only allowed when GC is enabled";
    }
  }